

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void tpl_model_store(TplDepStats *tpl_stats_ptr,int mi_row,int mi_col,int stride,
                    TplDepStats *src_stats,uint8_t block_mis_log2)

{
  int iVar1;
  long *__dest;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  uint8_t in_R9B;
  TplDepStats *tpl_ptr;
  int index;
  undefined4 local_70;
  undefined4 local_6c;
  long local_68;
  long local_60;
  undefined4 local_58;
  undefined4 local_54;
  long local_50;
  long local_48;
  long local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  iVar1 = av1_tpl_ptr_pos(in_ESI,in_EDX,in_ECX,in_R9B);
  __dest = (long *)(in_RDI + (long)iVar1 * 200);
  memcpy(__dest,in_R8,200);
  if ((int)__dest[0x11] < 1) {
    local_34 = 1;
  }
  else {
    local_34 = (undefined4)__dest[0x11];
  }
  *(undefined4 *)(__dest + 0x11) = local_34;
  if (*(int *)((long)__dest + 0x8c) < 1) {
    local_38 = 1;
  }
  else {
    local_38 = *(undefined4 *)((long)__dest + 0x8c);
  }
  *(undefined4 *)((long)__dest + 0x8c) = local_38;
  if (__dest[1] < 1) {
    local_40 = 1;
  }
  else {
    local_40 = __dest[1];
  }
  __dest[1] = local_40;
  if (*__dest < 1) {
    local_48 = 1;
  }
  else {
    local_48 = *__dest;
  }
  *__dest = local_48;
  if (__dest[3] < 1) {
    local_50 = 1;
  }
  else {
    local_50 = __dest[3];
  }
  __dest[3] = local_50;
  if ((int)__dest[0x12] < 1) {
    local_54 = 1;
  }
  else {
    local_54 = (undefined4)__dest[0x12];
  }
  *(undefined4 *)(__dest + 0x12) = local_54;
  if (*(int *)((long)__dest + 0x94) < 1) {
    local_58 = 1;
  }
  else {
    local_58 = *(undefined4 *)((long)__dest + 0x94);
  }
  *(undefined4 *)((long)__dest + 0x94) = local_58;
  if (__dest[6] < 1) {
    local_60 = 1;
  }
  else {
    local_60 = __dest[6];
  }
  __dest[6] = local_60;
  if (__dest[7] < 1) {
    local_68 = 1;
  }
  else {
    local_68 = __dest[7];
  }
  __dest[7] = local_68;
  if (*(int *)((long)__dest + 0x9c) < 1) {
    local_6c = 1;
  }
  else {
    local_6c = *(undefined4 *)((long)__dest + 0x9c);
  }
  *(undefined4 *)((long)__dest + 0x9c) = local_6c;
  if ((int)__dest[0x14] < 1) {
    local_70 = 1;
  }
  else {
    local_70 = (undefined4)__dest[0x14];
  }
  *(undefined4 *)(__dest + 0x14) = local_70;
  return;
}

Assistant:

static inline void tpl_model_store(TplDepStats *tpl_stats_ptr, int mi_row,
                                   int mi_col, int stride,
                                   const TplDepStats *src_stats,
                                   uint8_t block_mis_log2) {
  int index = av1_tpl_ptr_pos(mi_row, mi_col, stride, block_mis_log2);
  TplDepStats *tpl_ptr = &tpl_stats_ptr[index];
  *tpl_ptr = *src_stats;
  tpl_ptr->intra_cost = AOMMAX(1, tpl_ptr->intra_cost);
  tpl_ptr->inter_cost = AOMMAX(1, tpl_ptr->inter_cost);
  tpl_ptr->srcrf_dist = AOMMAX(1, tpl_ptr->srcrf_dist);
  tpl_ptr->srcrf_sse = AOMMAX(1, tpl_ptr->srcrf_sse);
  tpl_ptr->recrf_dist = AOMMAX(1, tpl_ptr->recrf_dist);
  tpl_ptr->srcrf_rate = AOMMAX(1, tpl_ptr->srcrf_rate);
  tpl_ptr->recrf_rate = AOMMAX(1, tpl_ptr->recrf_rate);
  tpl_ptr->cmp_recrf_dist[0] = AOMMAX(1, tpl_ptr->cmp_recrf_dist[0]);
  tpl_ptr->cmp_recrf_dist[1] = AOMMAX(1, tpl_ptr->cmp_recrf_dist[1]);
  tpl_ptr->cmp_recrf_rate[0] = AOMMAX(1, tpl_ptr->cmp_recrf_rate[0]);
  tpl_ptr->cmp_recrf_rate[1] = AOMMAX(1, tpl_ptr->cmp_recrf_rate[1]);
}